

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void helper_chk2_m68k(CPUM68KState_conflict *env,int32_t val,int32_t lb,int32_t ub)

{
  bool bVar1;
  CPUM68KState_conflict *__mptr;
  uintptr_t unaff_retaddr;
  
  env->cc_z = (uint)(val != ub && val != lb);
  if (ub < lb) {
    bVar1 = val < lb && ub < val;
    env->cc_c = (uint)bVar1;
    if (bVar1) {
LAB_006ede05:
      cpu_restore_state_m68k((CPUState *)(env[-0x40].fregs + 2),unaff_retaddr,true);
      env->cc_op = 1;
      env->pc = env->pc + 4;
      *(undefined4 *)(env[-3].fregs + 2) = 6;
      cpu_loop_exit_m68k((CPUState *)(env[-0x40].fregs + 2));
    }
  }
  else {
    env->cc_c = (uint)(ub < val || val < lb);
    if (ub < val || val < lb) goto LAB_006ede05;
  }
  return;
}

Assistant:

void HELPER(chk2)(CPUM68KState *env, int32_t val, int32_t lb, int32_t ub)
{
    /*
     * From the specs:
     *   X: Not affected, N,V: Undefined,
     *   Z: Set if val is equal to lb or ub
     *   C: Set if val < lb or val > ub, cleared otherwise
     * We implement here values found from a real MC68040:
     *   X,N,V: Not affected
     *   Z: Set if val is equal to lb or ub
     *   C: if lb <= ub: set if val < lb or val > ub, cleared otherwise
     *      if lb > ub: set if val > ub and val < lb, cleared otherwise
     */
    env->cc_z = val != lb && val != ub;
    env->cc_c = lb <= ub ? val < lb || val > ub : val > ub && val < lb;

    if (env->cc_c) {
        CPUState *cs = env_cpu(env);

        /* Recover PC and CC_OP for the beginning of the insn.  */
        cpu_restore_state(cs, GETPC(), true);

        /* flags have been modified by gen_flush_flags() */
        env->cc_op = CC_OP_FLAGS;
        /* Adjust PC to end of the insn.  */
        env->pc += 4;

        cs->exception_index = EXCP_CHK;
        cpu_loop_exit(cs);
    }
}